

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QRect __thiscall QDockAreaLayout::itemRect(QDockAreaLayout *this,QList<int> *path)

{
  long lVar1;
  int *piVar2;
  QDockAreaLayoutInfo *in_RSI;
  QList<int> *in_RDI;
  long in_FS_OFFSET;
  QRect QVar3;
  int index;
  qsizetype in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = QList<int>::first(in_RDI);
  iVar4 = *piVar2;
  QList<int>::mid((QList<int> *)in_RSI,CONCAT44(iVar4,in_stack_ffffffffffffffb8),
                  in_stack_ffffffffffffffb0);
  QVar3 = QDockAreaLayoutInfo::itemRect
                    (in_RSI,(QList<int> *)CONCAT44(iVar4,in_stack_ffffffffffffffb8));
  QList<int>::~QList((QList<int> *)0x578478);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QRect QDockAreaLayout::itemRect(const QList<int> &path) const
{
    Q_ASSERT(!path.isEmpty());
    const int index = path.first();
    Q_ASSERT(index >= 0 && index < QInternal::DockCount);
    return docks[index].itemRect(path.mid(1));
}